

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O0

BOOL __thiscall Js::GlobalObject::HasOwnProperty(GlobalObject *this,PropertyId propertyId)

{
  PropertyQueryFlags val;
  BOOL BVar1;
  RecyclableObject **ppRVar2;
  RecyclableObject *this_00;
  bool local_21;
  bool local_15;
  PropertyId propertyId_local;
  GlobalObject *this_local;
  
  val = DynamicObject::HasPropertyQuery((DynamicObject *)this,propertyId,(PropertyValueInfo *)0x0);
  BVar1 = JavascriptConversion::PropertyQueryFlagsToBoolean(val);
  local_15 = true;
  if (BVar1 == 0) {
    ppRVar2 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                        ((WriteBarrierPtr *)&this->directHostObject);
    local_21 = false;
    if (*ppRVar2 != (RecyclableObject *)0x0) {
      this_00 = Memory::WriteBarrierPtr<Js::RecyclableObject>::operator->(&this->directHostObject);
      BVar1 = RecyclableObject::HasProperty(this_00,propertyId);
      local_21 = BVar1 != 0;
    }
    local_15 = local_21;
  }
  return (BOOL)local_15;
}

Assistant:

BOOL GlobalObject::HasOwnProperty(PropertyId propertyId)
    {
        return JavascriptConversion::PropertyQueryFlagsToBoolean(DynamicObject::HasPropertyQuery(propertyId, nullptr /*info*/)) ||
            (this->directHostObject && this->directHostObject->HasProperty(propertyId));
    }